

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sec.c
# Opt level: O1

void duckdb_je_sec_stats_merge(tsdn_t *tsdn,sec_t *sec,sec_stats_t *stats)

{
  long *plVar1;
  sec_shard_t *psVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  if ((sec->opts).nshards == 0) {
    lVar7 = 0;
  }
  else {
    lVar6 = 0x48;
    lVar5 = 0;
    uVar4 = 0;
    lVar7 = 0;
    do {
      psVar2 = sec->shards;
      iVar3 = pthread_mutex_trylock((pthread_mutex_t *)((long)&(psVar2->mtx).field_0 + lVar6));
      if (iVar3 != 0) {
        duckdb_je_malloc_mutex_lock_slow((malloc_mutex_t *)((long)&(psVar2->mtx).field_0 + lVar5));
        *(undefined1 *)((long)&(psVar2->mtx).field_0 + lVar5 + 0x40) = 1;
      }
      plVar1 = (long *)((long)&(psVar2->mtx).field_0 + lVar5 + 0x38);
      *plVar1 = *plVar1 + 1;
      if (*(tsdn_t **)((long)&(psVar2->mtx).field_0 + lVar5 + 0x30) != tsdn) {
        *(tsdn_t **)((long)&(psVar2->mtx).field_0 + lVar5 + 0x30) = tsdn;
        plVar1 = (long *)((long)&(psVar2->mtx).field_0 + lVar5 + 0x28);
        *plVar1 = *plVar1 + 1;
      }
      psVar2 = sec->shards;
      lVar7 = lVar7 + *(long *)((long)&psVar2->bytes_cur + lVar5);
      *(undefined1 *)((long)&(psVar2->mtx).field_0 + lVar5 + 0x40) = 0;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&(psVar2->mtx).field_0 + lVar6));
      uVar4 = uVar4 + 1;
      lVar6 = lVar6 + 0x90;
      lVar5 = lVar5 + 0x90;
    } while (uVar4 < (sec->opts).nshards);
  }
  stats->bytes = stats->bytes + lVar7;
  return;
}

Assistant:

void
sec_stats_merge(tsdn_t *tsdn, sec_t *sec, sec_stats_t *stats) {
	size_t sum = 0;
	for (size_t i = 0; i < sec->opts.nshards; i++) {
		/*
		 * We could save these lock acquisitions by making bytes_cur
		 * atomic, but stats collection is rare anyways and we expect
		 * the number and type of stats to get more interesting.
		 */
		malloc_mutex_lock(tsdn, &sec->shards[i].mtx);
		sum += sec->shards[i].bytes_cur;
		malloc_mutex_unlock(tsdn, &sec->shards[i].mtx);
	}
	stats->bytes += sum;
}